

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

void __thiscall ritobin::io::text_write_impl::TextWriter::write_hex(TextWriter *this,uint32_t hex)

{
  size_t i;
  ulong uVar1;
  string_view str;
  char result [10];
  char local_10 [16];
  
  local_10[8] = '\0';
  local_10[9] = '\0';
  local_10[0] = '0';
  local_10[1] = 'x';
  local_10[2] = '\0';
  local_10[3] = '\0';
  local_10[4] = '\0';
  local_10[5] = '\0';
  local_10[6] = '\0';
  local_10[7] = '\0';
  uVar1 = 9;
  do {
    local_10[uVar1] = "0123456789abcdef"[hex & 0xf];
    hex = hex >> 4;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  str._M_str = local_10;
  str._M_len = 10;
  write_raw(this,str);
  return;
}

Assistant:

void write_hex(uint32_t hex) noexcept {
            constexpr char digits[] = "0123456789abcdef";
            char result[10] = { '0', 'x' };
            for (size_t i = 9; i > 1; i--) {
                result[i] = digits[hex & 0x0Fu];
                hex >>= 4;
            }
            write_raw(std::string_view{ result, sizeof(result) });
        }